

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O0

Matrix3x3 * CMU462::Matrix3x3::crossProduct(Matrix3x3 *__return_storage_ptr__,Vector3D *u)

{
  double dVar1;
  double *pdVar2;
  Vector3D *u_local;
  Matrix3x3 *B;
  
  Matrix3x3(__return_storage_ptr__);
  pdVar2 = operator()(__return_storage_ptr__,0,0);
  *pdVar2 = 0.0;
  dVar1 = u->z;
  pdVar2 = operator()(__return_storage_ptr__,0,1);
  *pdVar2 = -dVar1;
  dVar1 = u->y;
  pdVar2 = operator()(__return_storage_ptr__,0,2);
  *pdVar2 = dVar1;
  dVar1 = u->z;
  pdVar2 = operator()(__return_storage_ptr__,1,0);
  *pdVar2 = dVar1;
  pdVar2 = operator()(__return_storage_ptr__,1,1);
  *pdVar2 = 0.0;
  dVar1 = u->x;
  pdVar2 = operator()(__return_storage_ptr__,1,2);
  *pdVar2 = -dVar1;
  dVar1 = u->y;
  pdVar2 = operator()(__return_storage_ptr__,2,0);
  *pdVar2 = -dVar1;
  dVar1 = u->x;
  pdVar2 = operator()(__return_storage_ptr__,2,1);
  *pdVar2 = dVar1;
  pdVar2 = operator()(__return_storage_ptr__,2,2);
  *pdVar2 = 0.0;
  return __return_storage_ptr__;
}

Assistant:

Matrix3x3 Matrix3x3::crossProduct( const Vector3D& u ) {
    Matrix3x3 B;

    B(0,0) =   0.;  B(0,1) = -u.z;  B(0,2) =  u.y;
    B(1,0) =  u.z;  B(1,1) =   0.;  B(1,2) = -u.x;
    B(2,0) = -u.y;  B(2,1) =  u.x;  B(2,2) =   0.;

    return B;
  }